

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

void * rw::wdgl::matfxOpen(void *o,int32 param_2,int32 param_3)

{
  DAT_00143d00 = makeMatFXPipeline();
  return o;
}

Assistant:

static void*
matfxOpen(void *o, int32, int32)
{
	matFXGlobals.pipelines[PLATFORM_WDGL] = makeMatFXPipeline();
	return o;
}